

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall chrono::ChVector<double>::ArchiveIN(ChVector<double> *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChVector<double>>(marchive);
  local_30._name = "x";
  local_30._flags = '\0';
  local_30._value = this->m_data;
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = this->m_data + 1;
  local_48._name = "y";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = this->m_data + 2;
  local_60._name = "z";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

inline void ChVector<Real>::ArchiveIN(ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<ChVector<double>>();  // must use specialized template (any)
    // stream in all member m_data
    marchive >> CHNVP(m_data[0], "x");
    marchive >> CHNVP(m_data[1], "y");
    marchive >> CHNVP(m_data[2], "z");
}